

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_update(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
            *this,keyed_iterator keyed_position,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
           time_point expire_time)

{
  pointer ppVar1;
  utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
  *this_00;
  __off64_t *in_R8;
  size_t in_R9;
  _List_const_iterator<unsigned_long> local_50;
  iterator local_48;
  _List_const_iterator<unsigned_long> local_40;
  reference local_38;
  element *e;
  size_t element_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  keyed_iterator keyed_position_local;
  
  element_idx = (size_t)value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)expire_time.__d.__r;
  expire_time_local.__d.__r =
       (duration)
       (duration)
       keyed_position.
       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur;
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::operator->
                     ((_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false> *
                      )&expire_time_local);
  e = (element *)ppVar1->second;
  local_38 = std::
             vector<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
             ::operator[]((vector<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
                           *)(this + 0x38),(size_type)e);
  (local_38->m_expire_time).__d.__r = (rep)this_local;
  std::__cxx11::string::operator=((string *)&local_38->m_value,(string *)element_idx);
  this_00 = this + 0xa0;
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa0));
  std::_List_const_iterator<unsigned_long>::_List_const_iterator(&local_40,&local_48);
  std::_List_const_iterator<unsigned_long>::_List_const_iterator
            (&local_50,&local_38->m_ttl_position);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(int)local_40._M_node,
             (__off64_t *)(this + 0xa0),(int)local_50._M_node,in_R8,in_R9,(uint)this_00);
  do_access(this,local_38);
  return;
}

Assistant:

auto do_update(keyed_iterator keyed_position, value_type&& value, std::chrono::steady_clock::time_point expire_time)
        -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // push to the end of the ttl list
        m_ttl_list.splice(m_ttl_list.end(), m_ttl_list, e.m_ttl_position);

        do_access(e);
    }